

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::bt_peer_connection_handle::switch_recv_crypto
          (bt_peer_connection_handle *this,shared_ptr<libtorrent::crypto_plugin> *crypto)

{
  element_type *this_00;
  shared_ptr<libtorrent::crypto_plugin> local_38;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::bt_peer_connection> pc;
  shared_ptr<libtorrent::crypto_plugin> *crypto_local;
  bt_peer_connection_handle *this_local;
  
  pc.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)crypto;
  native_handle((bt_peer_connection_handle *)local_28);
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
  ::std::shared_ptr<libtorrent::crypto_plugin>::shared_ptr(&local_38,crypto);
  libtorrent::aux::bt_peer_connection::switch_recv_crypto(this_00,&local_38);
  ::std::shared_ptr<libtorrent::crypto_plugin>::~shared_ptr(&local_38);
  ::std::shared_ptr<libtorrent::aux::bt_peer_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::bt_peer_connection> *)local_28);
  return;
}

Assistant:

void bt_peer_connection_handle::switch_recv_crypto(std::shared_ptr<crypto_plugin> crypto)
{
#if !defined TORRENT_DISABLE_ENCRYPTION
	std::shared_ptr<aux::bt_peer_connection> pc = native_handle();
	TORRENT_ASSERT(pc);
	pc->switch_recv_crypto(std::move(crypto));
#else
	TORRENT_UNUSED(crypto);
#endif
}